

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

int cs_impl::try_convert_and_check<int,_cs::numeric,_int,_0UL>::convert(var *val)

{
  bool bVar1;
  int *piVar2;
  runtime_error *this;
  string *str;
  char *in_stack_000002c8;
  any *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined1 uVar3;
  type_info *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  int local_4;
  
  any::type(in_stack_fffffffffffffe70);
  bVar1 = std::type_info::operator==
                    (in_stack_fffffffffffffe80,
                     (type_info *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  if (bVar1) {
    convert_helper<cs::numeric>::get_val((any *)0x42e37e);
    local_4 = type_convertor<cs::numeric,_int>::convert((numeric *)0x42e386);
  }
  else {
    any::type(in_stack_fffffffffffffe70);
    bVar1 = std::type_info::operator==
                      (in_stack_fffffffffffffe80,
                       (type_info *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    if (!bVar1) {
      uVar3 = 1;
      this = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffea8);
      std::operator+((char *)CONCAT17(uVar3,in_stack_fffffffffffffe78),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar3,in_stack_fffffffffffffe78),(char *)this);
      str = (string *)get_name_of_type<int>();
      cxx_demangle_abi_cxx11_(in_stack_000002c8);
      std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar3,in_stack_fffffffffffffe78),(char *)this);
      get_name_of_type<cs::numeric>();
      cxx_demangle_abi_cxx11_(in_stack_000002c8);
      std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar3,in_stack_fffffffffffffe78),(char *)this);
      any::get_type_name_abi_cxx11_((any *)CONCAT17(uVar3,in_stack_fffffffffffffe78));
      std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      cs::runtime_error::runtime_error(this,str);
      __cxa_throw(this,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
    piVar2 = convert_helper<int>::get_val((any *)0x42e3c1);
    local_4 = *piVar2;
  }
  return local_4;
}

Assistant:

inline static _TargetT convert(cs::var &val)
		{
			if (val.type() == typeid(_SourceT))
				return type_convertor<_SourceT, _TargetT>::convert(convert_helper<_SourceT>::get_val(val));
			else if (val.type() == typeid(_TargetT))
				return convert_helper<_TargetT>::get_val(val);
			else
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<_TargetT>()) + ", compatible with " +
				                        cxx_demangle(get_name_of_type<_SourceT>()) + ", provided " +
				                        val.get_type_name());
		}